

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_constants_obj_make(parser *p)

{
  undefined2 uVar1;
  wchar_t wVar2;
  int iVar3;
  void *pvVar4;
  char *__s1;
  wchar_t value;
  char *label;
  angband_constants *z;
  parser *p_local;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar2 = parser_getint(p,"value");
  if (wVar2 < L'\0') {
    p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    iVar3 = strcmp(__s1,"max-depth");
    uVar1 = (undefined2)wVar2;
    if (iVar3 == 0) {
      *(undefined2 *)((long)pvVar4 + 0x82) = uVar1;
    }
    else {
      iVar3 = strcmp(__s1,"great-obj");
      if (iVar3 == 0) {
        *(undefined2 *)((long)pvVar4 + 0x84) = uVar1;
      }
      else {
        iVar3 = strcmp(__s1,"great-ego");
        if (iVar3 == 0) {
          *(undefined2 *)((long)pvVar4 + 0x86) = uVar1;
        }
        else {
          iVar3 = strcmp(__s1,"fuel-torch");
          if (iVar3 == 0) {
            *(undefined2 *)((long)pvVar4 + 0x88) = uVar1;
          }
          else {
            iVar3 = strcmp(__s1,"fuel-lamp");
            if (iVar3 == 0) {
              *(undefined2 *)((long)pvVar4 + 0x8a) = uVar1;
            }
            else {
              iVar3 = strcmp(__s1,"default-lamp");
              if (iVar3 != 0) {
                return PARSE_ERROR_UNDEFINED_DIRECTIVE;
              }
              *(undefined2 *)((long)pvVar4 + 0x8c) = uVar1;
            }
          }
        }
      }
    }
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_constants_obj_make(struct parser *p) {
	struct angband_constants *z;
	const char *label;
	int value;

	z = parser_priv(p);
	label = parser_getsym(p, "label");
	value = parser_getint(p, "value");

	if (value < 0)
		return PARSE_ERROR_INVALID_VALUE;

	if (streq(label, "max-depth"))
		z->max_obj_depth = value;
	else if (streq(label, "great-obj"))
		z->great_obj = value;
	else if (streq(label, "great-ego"))
		z->great_ego = value;
	else if (streq(label, "fuel-torch"))
		z->fuel_torch = value;
	else if (streq(label, "fuel-lamp"))
		z->fuel_lamp = value;
	else if (streq(label, "default-lamp"))
		z->default_lamp = value;
	else
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;

	return PARSE_ERROR_NONE;
}